

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tst_helpers_qpromiseall.cpp
# Opt level: O2

void __thiscall
tst_deprecations_helpers_qpromiseall::preserveOrder(tst_deprecations_helpers_qpromiseall *this)

{
  QSharedData *pQVar1;
  bool bVar2;
  long lVar3;
  initializer_list<QtPromise::QPromise<int>_> args;
  initializer_list<int> args_00;
  QArrayDataPointer<QtPromise::QPromise<int>_> local_c8;
  QArrayDataPointer<int> local_a8;
  PromiseData<int> *local_90;
  undefined **local_88;
  PromiseData<int> *local_80;
  QPromise<int> p2;
  QPromise<int> p1;
  QPromise<int> p0;
  QPromise<QList<int>_> p;
  QArrayDataPointer<int> local_38;
  int local_1c [3];
  
  local_c8.d._0_4_ = 0x2a;
  QtPromise::resolve<int>((QtPromise *)&local_a8,(int *)&local_c8);
  QtPromise::QPromiseBase<int>::tap<QtPromise::QPromiseBase<int>::delay(int)const::_lambda()_1_>
            (&p0.super_QPromiseBase<int>,(anon_class_4_1_898ef5c2)(int)&local_a8);
  QtPromise::QPromiseBase<int>::~QPromiseBase((QPromiseBase<int> *)&local_a8);
  local_c8.d._0_4_ = 0x2b;
  QtPromise::resolve<int>((QtPromise *)&local_a8,(int *)&local_c8);
  QtPromise::QPromiseBase<int>::tap<QtPromise::QPromiseBase<int>::delay(int)const::_lambda()_1_>
            (&p1.super_QPromiseBase<int>,(anon_class_4_1_898ef5c2)(int)&local_a8);
  QtPromise::QPromiseBase<int>::~QPromiseBase((QPromiseBase<int> *)&local_a8);
  local_c8.d = (Data *)CONCAT44(local_c8.d._4_4_,0x2c);
  QtPromise::resolve<int>((QtPromise *)&local_a8,(int *)&local_c8);
  QtPromise::QPromiseBase<int>::tap<QtPromise::QPromiseBase<int>::delay(int)const::_lambda()_1_>
            (&p2.super_QPromiseBase<int>,(anon_class_4_1_898ef5c2)(int)&local_a8);
  QtPromise::QPromiseBase<int>::~QPromiseBase((QPromiseBase<int> *)&local_a8);
  local_a8.ptr = (int *)p0.super_QPromiseBase<int>.m_d.d;
  if (p0.super_QPromiseBase<int>.m_d.d != (PromiseData<int> *)0x0) {
    LOCK();
    pQVar1 = &((p0.super_QPromiseBase<int>.m_d.d)->super_PromiseDataBase<int,_void_(const_int_&)>).
              super_QSharedData;
    (pQVar1->ref).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
    super___atomic_base<int>._M_i =
         (pQVar1->ref).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
         super___atomic_base<int>._M_i + 1;
    UNLOCK();
  }
  local_a8.d = (Data *)&PTR__QPromiseBase_00128bc8;
  local_90 = p1.super_QPromiseBase<int>.m_d.d;
  if (p1.super_QPromiseBase<int>.m_d.d != (PromiseData<int> *)0x0) {
    LOCK();
    pQVar1 = &((p1.super_QPromiseBase<int>.m_d.d)->super_PromiseDataBase<int,_void_(const_int_&)>).
              super_QSharedData;
    (pQVar1->ref).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
    super___atomic_base<int>._M_i =
         (pQVar1->ref).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
         super___atomic_base<int>._M_i + 1;
    UNLOCK();
  }
  local_a8.size = (qsizetype)&PTR__QPromiseBase_00128bc8;
  local_80 = p2.super_QPromiseBase<int>.m_d.d;
  if (p2.super_QPromiseBase<int>.m_d.d != (PromiseData<int> *)0x0) {
    LOCK();
    pQVar1 = &((p2.super_QPromiseBase<int>.m_d.d)->super_PromiseDataBase<int,_void_(const_int_&)>).
              super_QSharedData;
    (pQVar1->ref).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
    super___atomic_base<int>._M_i =
         (pQVar1->ref).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
         super___atomic_base<int>._M_i + 1;
    UNLOCK();
  }
  local_88 = &PTR__QPromiseBase_00128bc8;
  args._M_len = 3;
  args._M_array = (iterator)&local_a8;
  QList<QtPromise::QPromise<int>_>::QList((QList<QtPromise::QPromise<int>_> *)&local_c8,args);
  QtPromise::all<int,_QList>((QtPromise *)&p,(QList<QtPromise::QPromise<int>_> *)&local_c8);
  QArrayDataPointer<QtPromise::QPromise<int>_>::~QArrayDataPointer(&local_c8);
  lVar3 = 0x20;
  do {
    QtPromise::QPromiseBase<int>::~QPromiseBase((QPromiseBase<int> *)((long)&local_a8.d + lVar3));
    lVar3 = lVar3 + -0x10;
  } while (lVar3 != -0x10);
  bVar2 = QtPromisePrivate::PromiseDataBase<int,_void_(const_int_&)>::isPending
                    (&(p0.super_QPromiseBase<int>.m_d.d)->
                      super_PromiseDataBase<int,_void_(const_int_&)>);
  local_c8.d._0_1_ = 1;
  local_a8.d._0_1_ = bVar2;
  bVar2 = QTest::qCompare<bool,bool>
                    ((bool *)&local_a8,(bool *)&local_c8,"p0.isPending()","true",
                     "/workspace/llm4binary/github/license_c_cmakelists/simonbrunel[P]qtpromise/tests/auto/qtpromise/deprecations/tst_helpers_qpromiseall.cpp"
                     ,0xbf);
  if (bVar2) {
    local_a8.d._0_1_ =
         QtPromisePrivate::PromiseDataBase<int,_void_(const_int_&)>::isPending
                   (&(p1.super_QPromiseBase<int>.m_d.d)->
                     super_PromiseDataBase<int,_void_(const_int_&)>);
    local_c8.d._0_1_ = 1;
    bVar2 = QTest::qCompare<bool,bool>
                      ((bool *)&local_a8,(bool *)&local_c8,"p1.isPending()","true",
                       "/workspace/llm4binary/github/license_c_cmakelists/simonbrunel[P]qtpromise/tests/auto/qtpromise/deprecations/tst_helpers_qpromiseall.cpp"
                       ,0xc0);
    if (bVar2) {
      local_a8.d._0_1_ =
           QtPromisePrivate::PromiseDataBase<int,_void_(const_int_&)>::isPending
                     (&(p2.super_QPromiseBase<int>.m_d.d)->
                       super_PromiseDataBase<int,_void_(const_int_&)>);
      local_c8.d._0_1_ = 1;
      bVar2 = QTest::qCompare<bool,bool>
                        ((bool *)&local_a8,(bool *)&local_c8,"p2.isPending()","true",
                         "/workspace/llm4binary/github/license_c_cmakelists/simonbrunel[P]qtpromise/tests/auto/qtpromise/deprecations/tst_helpers_qpromiseall.cpp"
                         ,0xc1);
      if (bVar2) {
        local_a8.d._0_1_ =
             QtPromisePrivate::PromiseDataBase<QList<int>,_void_(const_QList<int>_&)>::isPending
                       (&(p.super_QPromiseBase<QList<int>_>.m_d.d)->
                         super_PromiseDataBase<QList<int>,_void_(const_QList<int>_&)>);
        local_c8.d._0_1_ = 1;
        bVar2 = QTest::qCompare<bool,bool>
                          ((bool *)&local_a8,(bool *)&local_c8,"p.isPending()","true",
                           "/workspace/llm4binary/github/license_c_cmakelists/simonbrunel[P]qtpromise/tests/auto/qtpromise/deprecations/tst_helpers_qpromiseall.cpp"
                           ,0xc2);
        if (bVar2) {
          local_c8.d._0_1_ = 0;
          local_c8.d._1_7_ = 0;
          local_c8.ptr = (QPromise<int> *)0x0;
          local_c8.size = 0;
          waitForValue<QList<int>>((QList<int> *)&local_a8,&p,(QList<int> *)&local_c8);
          local_1c[0] = 0x2a;
          local_1c[1] = 0x2b;
          local_1c[2] = 0x2c;
          args_00._M_len = 3;
          args_00._M_array = local_1c;
          QList<int>::QList((QList<int> *)&local_38,args_00);
          bVar2 = QTest::qCompare<int>
                            ((QList<int> *)&local_a8,(QList<int> *)&local_38,
                             "waitForValue(p, QVector<int>{})","(QVector<int>{42, 43, 44})",
                             "/workspace/llm4binary/github/license_c_cmakelists/simonbrunel[P]qtpromise/tests/auto/qtpromise/deprecations/tst_helpers_qpromiseall.cpp"
                             ,0xc3);
          QArrayDataPointer<int>::~QArrayDataPointer(&local_38);
          QArrayDataPointer<int>::~QArrayDataPointer(&local_a8);
          QArrayDataPointer<int>::~QArrayDataPointer((QArrayDataPointer<int> *)&local_c8);
          if (bVar2) {
            local_a8.d._0_1_ =
                 QtPromisePrivate::PromiseDataBase<int,_void_(const_int_&)>::isFulfilled
                           (&(p0.super_QPromiseBase<int>.m_d.d)->
                             super_PromiseDataBase<int,_void_(const_int_&)>);
            local_c8.d._0_1_ = 1;
            bVar2 = QTest::qCompare<bool,bool>
                              ((bool *)&local_a8,(bool *)&local_c8,"p0.isFulfilled()","true",
                               "/workspace/llm4binary/github/license_c_cmakelists/simonbrunel[P]qtpromise/tests/auto/qtpromise/deprecations/tst_helpers_qpromiseall.cpp"
                               ,0xc4);
            if (bVar2) {
              local_a8.d._0_1_ =
                   QtPromisePrivate::PromiseDataBase<int,_void_(const_int_&)>::isFulfilled
                             (&(p1.super_QPromiseBase<int>.m_d.d)->
                               super_PromiseDataBase<int,_void_(const_int_&)>);
              local_c8.d._0_1_ = 1;
              bVar2 = QTest::qCompare<bool,bool>
                                ((bool *)&local_a8,(bool *)&local_c8,"p1.isFulfilled()","true",
                                 "/workspace/llm4binary/github/license_c_cmakelists/simonbrunel[P]qtpromise/tests/auto/qtpromise/deprecations/tst_helpers_qpromiseall.cpp"
                                 ,0xc5);
              if (bVar2) {
                local_a8.d._0_1_ =
                     QtPromisePrivate::PromiseDataBase<int,_void_(const_int_&)>::isFulfilled
                               (&(p2.super_QPromiseBase<int>.m_d.d)->
                                 super_PromiseDataBase<int,_void_(const_int_&)>);
                local_c8.d._0_1_ = 1;
                QTest::qCompare<bool,bool>
                          ((bool *)&local_a8,(bool *)&local_c8,"p2.isFulfilled()","true",
                           "/workspace/llm4binary/github/license_c_cmakelists/simonbrunel[P]qtpromise/tests/auto/qtpromise/deprecations/tst_helpers_qpromiseall.cpp"
                           ,0xc6);
              }
            }
          }
        }
      }
    }
  }
  QtPromise::QPromiseBase<QList<int>_>::~QPromiseBase(&p.super_QPromiseBase<QList<int>_>);
  QtPromise::QPromiseBase<int>::~QPromiseBase(&p2.super_QPromiseBase<int>);
  QtPromise::QPromiseBase<int>::~QPromiseBase(&p1.super_QPromiseBase<int>);
  QtPromise::QPromiseBase<int>::~QPromiseBase(&p0.super_QPromiseBase<int>);
  return;
}

Assistant:

void tst_deprecations_helpers_qpromiseall::preserveOrder()
{
    auto p0 = QtPromise::resolve(42).delay(500);
    auto p1 = QtPromise::resolve(43).delay(100);
    auto p2 = QtPromise::resolve(44).delay(250);

    auto p = QtPromise::qPromiseAll(QVector<QtPromise::QPromise<int>>{p0, p1, p2});

    Q_STATIC_ASSERT((std::is_same<decltype(p), QtPromise::QPromise<QVector<int>>>::value));
    QCOMPARE(p0.isPending(), true);
    QCOMPARE(p1.isPending(), true);
    QCOMPARE(p2.isPending(), true);
    QCOMPARE(p.isPending(), true);
    QCOMPARE(waitForValue(p, QVector<int>{}), (QVector<int>{42, 43, 44}));
    QCOMPARE(p0.isFulfilled(), true);
    QCOMPARE(p1.isFulfilled(), true);
    QCOMPARE(p2.isFulfilled(), true);
}